

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_ManExtractGroupInt
               (Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vFonIns,Vec_Int_t *vFonOuts
               )

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int *piVar4;
  int x;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  uVar8 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar8) {
    piVar4 = (p->vObjCopy).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar8 << 2);
    }
    (p->vObjCopy).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_003d88ee;
    (p->vObjCopy).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar8 * 4);
  }
  (p->vObjCopy).nSize = uVar8;
  uVar8 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar8) {
    piVar4 = (p->vFonCopy).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar8 << 2);
    }
    (p->vFonCopy).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_003d88ee:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar8 * 4);
  }
  (p->vFonCopy).nSize = uVar8;
  if (0 < vFonIns->nSize) {
    lVar9 = 0;
    do {
      uVar8 = vFonIns->pArray[lVar9];
      uVar3 = Cba_ObjAlloc(pNew,CBA_OBJ_PI,0,1);
      if ((int)uVar3 < 1) goto LAB_003d8860;
      if ((pNew->vObjFon0).nSize <= (int)uVar3) goto LAB_003d87db;
      if ((int)uVar8 < 1) goto LAB_003d8803;
      if ((p->vFonCopy).nSize <= (int)uVar8) goto LAB_003d87db;
      piVar4 = (p->vFonCopy).pArray;
      if (piVar4[uVar8] != 0) goto LAB_003d87fa;
      piVar4[uVar8] = (pNew->vObjFon0).pArray[uVar3];
      if (0 < (p->vObjName).nSize) {
        if ((p->vFonObj).nSize <= (int)uVar8) goto LAB_003d87db;
        iVar10 = (p->vFonObj).pArray[uVar8];
        if ((long)iVar10 < 1) goto LAB_003d887f;
        Vec_IntFillExtra(&p->vObjName,iVar10 + 1,0);
        if ((p->vObjName).nSize <= iVar10) goto LAB_003d87db;
        Cba_ObjSetName(pNew,uVar3,(p->vObjName).pArray[iVar10]);
      }
      if (0 < (p->vFonName).nSize) {
        if ((pNew->vObjFon0).nSize <= (int)uVar3) goto LAB_003d87db;
        iVar10 = (pNew->vObjFon0).pArray[uVar3];
        Vec_IntFillExtra(&p->vFonName,uVar8 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar8) goto LAB_003d87db;
        Cba_FonSetName(pNew,iVar10,(p->vFonName).pArray[uVar8]);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFonIns->nSize);
  }
  if (0 < vObjs->nSize) {
    lVar9 = 0;
    do {
      uVar8 = vObjs->pArray[lVar9];
      uVar3 = Cba_ObjDup(pNew,p,uVar8);
      if (0 < (p->vObjName).nSize) {
        if ((int)uVar8 < 1) {
LAB_003d887f:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vObjName,uVar8 + 1,0);
        if ((p->vObjName).nSize <= (int)uVar8) goto LAB_003d87db;
        Cba_ObjSetName(pNew,uVar3,(p->vObjName).pArray[uVar8]);
      }
      if ((int)uVar8 < 1) {
LAB_003d8860:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFon0).nSize <= (int)uVar8) || ((p->vObjFon0).nSize <= (int)(uVar8 + 1)))
      goto LAB_003d87db;
      uVar1 = (p->vObjFon0).pArray[uVar8];
      uVar6 = (ulong)uVar1;
      iVar10 = 0;
      while (iVar5 = (int)uVar6, iVar5 < (p->vObjFon0).pArray[(ulong)uVar8 + 1]) {
        if ((int)uVar3 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
        }
        if ((pNew->vObjFon0).nSize <= (int)uVar3) goto LAB_003d87db;
        if ((int)uVar1 < 1) goto LAB_003d8803;
        if ((p->vFonCopy).nSize <= iVar5) goto LAB_003d87db;
        piVar4 = (p->vFonCopy).pArray;
        if (piVar4[uVar6] != 0) goto LAB_003d87fa;
        piVar2 = (pNew->vObjFon0).pArray;
        piVar4[uVar6] = piVar2[uVar3] + iVar10;
        if (0 < (p->vFonName).nSize) {
          if ((pNew->vObjFon0).nSize <= (int)uVar3) goto LAB_003d87db;
          iVar11 = piVar2[uVar3];
          Vec_IntFillExtra(&p->vFonName,iVar5 + 1,0);
          if ((p->vFonName).nSize <= iVar5) goto LAB_003d87db;
          Cba_FonSetName(pNew,iVar11 + iVar10,(p->vFonName).pArray[uVar6]);
        }
        uVar6 = uVar6 + 1;
        iVar10 = iVar10 + 1;
        if ((p->vObjFon0).nSize <= (int)(uVar8 + 1)) goto LAB_003d87db;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vObjs->nSize);
  }
  if (0 < vObjs->nSize) {
    lVar9 = 0;
    do {
      uVar8 = vObjs->pArray[lVar9];
      if ((int)uVar8 < 1) {
        pcVar7 = "i>0";
LAB_003d88ae:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xee,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
      }
      if ((p->vObjCopy).nSize < 1) {
        pcVar7 = "Cba_NtkHasObjCopies(p)";
        goto LAB_003d88ae;
      }
      iVar10 = uVar8 + 1;
      Vec_IntFillExtra(&p->vObjCopy,iVar10,-1);
      if ((((p->vObjCopy).nSize <= (int)uVar8) || ((p->vObjFin0).nSize <= (int)uVar8)) ||
         ((p->vObjFin0).nSize <= iVar10)) goto LAB_003d87db;
      iVar5 = (p->vObjCopy).pArray[uVar8];
      uVar3 = (p->vObjFin0).pArray[uVar8];
      uVar6 = (ulong)uVar3;
      iVar11 = 0;
      while ((int)uVar6 < (p->vObjFin0).pArray[(ulong)uVar8 + 1]) {
        if ((int)uVar3 < 1) {
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar6) goto LAB_003d87db;
        x = (p->vFinFon).pArray[uVar6];
        if (0 < (long)x) {
          if ((p->vFonCopy).nSize <= x) goto LAB_003d87db;
          x = (p->vFonCopy).pArray[x];
        }
        Cba_ObjSetFinFon(pNew,iVar5,iVar11,x);
        uVar6 = uVar6 + 1;
        iVar11 = iVar11 + 1;
        if ((p->vObjFin0).nSize <= iVar10) goto LAB_003d87db;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vObjs->nSize);
  }
  if (0 < vFonOuts->nSize) {
    lVar9 = 0;
    do {
      uVar8 = vFonOuts->pArray[lVar9];
      iVar10 = Cba_ObjAlloc(pNew,CBA_OBJ_PO,1,0);
      if (0 < (p->vObjName).nSize) {
        if ((p->vFonName).nSize < 1) {
          pcVar7 = "Cba_NtkHasFonNames(p)";
LAB_003d88d6:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        if ((int)uVar8 < 1) {
          pcVar7 = "Cba_FonIsReal(f)";
          goto LAB_003d88d6;
        }
        Vec_IntFillExtra(&p->vFonName,uVar8 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar8) {
LAB_003d87db:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Cba_ObjSetName(pNew,iVar10,(p->vFonName).pArray[uVar8]);
      }
      if (0 < (int)uVar8) {
        if ((p->vFonCopy).nSize <= (int)uVar8) goto LAB_003d87db;
        uVar8 = (p->vFonCopy).pArray[uVar8];
      }
      Cba_ObjSetFinFon(pNew,iVar10,0,uVar8);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFonOuts->nSize);
  }
  if ((pNew->vObjType).nSize != (pNew->vObjType).nCap) {
    __assert_fail("Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bb,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFinFon).nSize != (pNew->vFinFon).nCap) {
    __assert_fail("Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bc,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFonObj).nSize != (pNew->vFonObj).nCap) {
    __assert_fail("Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bd,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  return;
LAB_003d8803:
  pcVar7 = "Cba_FonIsReal(f)";
  goto LAB_003d880a;
LAB_003d87fa:
  pcVar7 = "Cba_FonCopy(p, f) == 0";
LAB_003d880a:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x11c,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
}

Assistant:

void Cba_ManExtractGroupInt( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vFonIns, Vec_Int_t * vFonOuts )
{
    int i, k, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // create inputs and map fons
    Vec_IntForEachEntry( vFonIns, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PI, 0, 1 );
        Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, Cba_FonObj(p, iFon)) );
        if ( Cba_NtkHasFonNames(p) )
            Cba_FonSetName( pNew, Cba_ObjFon0(pNew, iObjNew), Cba_FonName(p, iFon) );

    }
    // create internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjDup( pNew, p, iObj );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, iObj) );
        Cba_ObjForEachFon( p, iObj, iFon, k )
        {
            Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, k) );
            if ( Cba_NtkHasFonNames(p) )
                Cba_FonSetName( pNew, Cba_ObjFon(pNew, iObjNew, k), Cba_FonName(p, iFon) );
        }
    }
    // connect internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjCopy( p, iObj );
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( pNew, iObjNew, k, Cba_FonCopy(p, iFon) );
    }
    // create POs
    Vec_IntForEachEntry( vFonOuts, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PO, 1, 0 );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_FonName(p, iFon) );
        Cba_ObjSetFinFon( pNew, iObjNew, 0, Cba_FonCopy(p, iFon) );
    }
    assert( Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew) );
    assert( Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew) );
    assert( Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew) );
}